

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O1

bool __thiscall
crnlib::command_line_params::get_value_as_bool
          (command_line_params *this,char *pKey,uint index,bool def)

{
  param_map_const_iterator pVar1;
  
  pVar1 = get_param(this,pKey,index);
  if ((_Rb_tree_header *)pVar1._M_node != &(this->m_param_map)._M_t._M_impl.super__Rb_tree_header) {
    def = -1 < (char)pVar1._M_node[2].field_0x4;
  }
  return def;
}

Assistant:

bool command_line_params::get_value_as_bool(const char* pKey, uint index, bool def) const {
  param_map_const_iterator it = get_param(pKey, index);
  if (it == end())
    return def;

  if (it->second.m_modifier)
    return it->second.m_modifier > 0;
  else
    return true;
}